

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::TcpConnection::handleWrite(TcpConnection *this)

{
  uint *puVar1;
  uint64_t *puVar2;
  EventLoop *pEVar3;
  char *pcVar4;
  Channel *this_00;
  bool bVar5;
  int iVar6;
  LogStream *pLVar7;
  char **ppcVar8;
  size_t sVar9;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1038 [16];
  code *local_1028;
  char local_1018 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1010;
  char *local_88 [4];
  _Any_data local_68;
  code *local_58;
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *local_48;
  __shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_38;
  
  pEVar3 = this->m_loop;
  bVar5 = EventLoop::isInLoopThread(pEVar3);
  if (!bVar5) {
    EventLoop::abortNotInLoopThread(pEVar3);
  }
  if ((((this->m_channel)._M_t.
        super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>._M_t.
        super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>.
        super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_events & 8) == 0) {
    if (g_logLevel < 1) {
      file._8_8_ = 0x11;
      file.m_data = "TcpConnection.cpp";
      Logger::Logger((Logger *)local_1038,file,399,TRACE,"handleWrite");
      if (0x10 < (uint)((int)local_88 - (int)local_88[0])) {
        builtin_strncpy(local_88[0],"Connection fd = ",0x10);
        local_88[0] = local_88[0] + 0x10;
      }
      pLVar7 = LogStream::operator<<
                         ((LogStream *)(local_1038 + 8),
                          ((this->m_channel)._M_t.
                           super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                           .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->m_fd)
      ;
      pcVar4 = (pLVar7->m_buffer).m_cur;
      ppcVar8 = &(pLVar7->m_buffer).m_cur;
      if (0x19 < (uint)((int)ppcVar8 - (int)pcVar4)) {
        builtin_strncpy(pcVar4," is down, no more writing",0x19);
        *ppcVar8 = *ppcVar8 + 0x19;
      }
      Logger::~Logger((Logger *)local_1038);
    }
  }
  else if ((this->m_outputBuffer).m_writerIndex != (this->m_outputBuffer).m_readerIndex) {
    local_48 = &this->m_writeCompleteCallback;
    do {
      while (sVar9 = (this->m_outputBuffer).m_readerIndex,
            sVar9 = sockets::sz_socket_write
                              (((this->m_channel)._M_t.
                                super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                                .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl)->
                               m_fd,(this->m_outputBuffer).m_buffer.
                                    super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                    super__Vector_impl_data._M_start + sVar9,
                               (this->m_outputBuffer).m_writerIndex - sVar9),
            sVar9 != 0xffffffffffffffff) {
        if ((long)sVar9 < 1) goto LAB_001345c7;
        puVar2 = &(this->m_netStatInfo).m_sendBytes;
        *puVar2 = *puVar2 + sVar9;
        Buffer::retrieve(&this->m_outputBuffer,sVar9);
        if ((this->m_outputBuffer).m_writerIndex == (this->m_outputBuffer).m_readerIndex) {
          this_00 = (this->m_channel)._M_t.
                    super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                    .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
          puVar1 = &this_00->m_events;
          *puVar1 = *puVar1 & 0xfffffff7;
          Channel::update(this_00);
          if ((this->m_writeCompleteCallback).super__Function_base._M_manager != (_Manager_type)0x0)
          {
            pEVar3 = this->m_loop;
            std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<sznet::net::TcpConnection,void>
                      (local_40,(__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *
                                )this);
            std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::function
                      ((function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)> *)
                       local_1038,local_48);
            local_1018[0] = (char)local_40[0];
            local_1018[1] = (char)local_40[1];
            local_1018[2] = (char)local_40[2];
            local_1018[3] = (char)local_40[3];
            local_1018[4] = (char)local_40[4];
            local_1018[5] = (char)local_40[5];
            local_1018[6] = (char)local_40[6];
            local_1018[7] = (char)local_40[7];
            p_Stack_1010 = p_Stack_38;
            _local_40 = ZEXT816(0) << 0x20;
            std::function<void()>::
            function<std::_Bind<std::function<void(std::shared_ptr<sznet::net::TcpConnection>const&)>(std::shared_ptr<sznet::net::TcpConnection>)>,void>
                      ((function<void()> *)local_68._M_pod_data,
                       (_Bind<std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_(std::shared_ptr<sznet::net::TcpConnection>)>
                        *)local_1038);
            EventLoop::queueInLoop(pEVar3,(Functor *)&local_68);
            if (local_58 != (code *)0x0) {
              (*local_58)(&local_68,&local_68,__destroy_functor);
            }
            if (p_Stack_1010 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1010);
            }
            if (local_1028 != (code *)0x0) {
              (*local_1028)((_Any_data *)local_1038,(_Any_data *)local_1038,__destroy_functor);
            }
            if (p_Stack_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_38);
            }
          }
          if (this->m_state == kDisconnecting) {
            shutdownInLoop(this);
          }
        }
        if ((this->m_outputBuffer).m_writerIndex == (this->m_outputBuffer).m_readerIndex) {
          return;
        }
      }
      iVar6 = sz_getlasterr();
    } while (iVar6 == 4);
LAB_001345c7:
    bVar5 = sockets::sz_wouldblock();
    if (!bVar5) {
      file_00._8_8_ = 0x11;
      file_00.m_data = "TcpConnection.cpp";
      Logger::Logger((Logger *)local_1038,file_00,0x185,false);
      if (0x1a < (uint)((int)local_88 - (int)local_88[0])) {
        builtin_strncpy(local_88[0],"TcpConnection::handleWrite",0x1a);
        local_88[0] = local_88[0] + 0x1a;
      }
      Logger::~Logger((Logger *)local_1038);
      handleError(this);
      handleClose(this);
    }
  }
  return;
}

Assistant:

void TcpConnection::handleWrite()
{
	m_loop->assertInLoopThread();
	if (m_channel->isWriting())
	{
		sz_ssize_t n = 0;
		while(m_outputBuffer.readableBytes() > 0)
		{
			do
			{
				n = sockets::sz_socket_write(m_channel->fd(), m_outputBuffer.peek(), m_outputBuffer.readableBytes());
			} while (n == -1 && sz_getlasterr() == sz_err_eintr);
			if (n > 0)
			{
				m_netStatInfo.m_sendBytes += n;
				m_outputBuffer.retrieve(n);
				if (m_outputBuffer.readableBytes() == 0)
				{
					m_channel->disableWriting();
					if (m_writeCompleteCallback)
					{
						m_loop->queueInLoop(std::bind(m_writeCompleteCallback, shared_from_this()));
					}
					if (m_state == kDisconnecting)
					{
						shutdownInLoop();
					}
				}
			}
			else
			{
				if (!sockets::sz_wouldblock())
				{
					LOG_SYSERR << "TcpConnection::handleWrite";
					handleError();
					handleClose();
				}
				return;
			}
		}
	}
	else
	{
		LOG_TRACE << "Connection fd = " << m_channel->fd()
			<< " is down, no more writing";
	}
}